

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarray.h
# Opt level: O0

void ** tommy_array_ref(tommy_array *array,tommy_count_t pos)

{
  long lVar1;
  tommy_uint_t tVar2;
  long in_FS_OFFSET;
  tommy_uint_t bsr;
  tommy_count_t pos_local;
  tommy_array *array_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (array->count <= pos) {
    __assert_fail("pos < array->count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/third-party/tommyds/tommyarray.h"
                  ,0x61,"void **tommy_array_ref(tommy_array *, tommy_count_t)");
  }
  tVar2 = tommy_ilog2_u32(pos | 1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return array->bucket[tVar2] + pos;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void** tommy_array_ref(tommy_array* array, tommy_count_t pos)
{
	tommy_uint_t bsr;

	assert(pos < array->count);

	/* get the highest bit set, in case of all 0, return 0 */
	bsr = tommy_ilog2_u32(pos | 1);

	return &array->bucket[bsr][pos];
}